

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luma_quantizer.cpp
# Opt level: O1

void __thiscall
LumaQuantizer::setQuantizer
          (LumaQuantizer *this,ptf_t ptf,uint bitdepth,colorSpace_t cs,uint bitdepthC,float maxLum,
          float minLum)

{
  uint uVar1;
  float *__dest;
  long lVar2;
  float *__src;
  float *pfVar3;
  ulong uVar4;
  float fVar5;
  
  if (this->m_mapping != (float *)0x0) {
    operator_delete__(this->m_mapping);
  }
  this->m_bitdepth = bitdepth;
  fVar5 = exp2f((float)bitdepth);
  this->m_maxVal = (int)fVar5 - 1;
  this->m_colorSpace = cs;
  this->m_bitdepthColor = bitdepthC;
  fVar5 = exp2f((float)bitdepthC);
  this->m_maxValColor = (int)fVar5 - 1;
  this->m_Lmax = maxLum;
  this->m_Lmin = minLum;
  uVar4 = (ulong)this->m_maxVal;
  __dest = (float *)operator_new__((ulong)(this->m_maxVal + 1) << 2);
  this->m_mapping = __dest;
  switch(ptf) {
  case PTF_PQ:
    setMappingPQ(this);
    return;
  case PTF_LOG:
    setMappingLog(this);
    return;
  case PTF_JND_HDRVDP:
    uVar1 = this->m_bitdepth;
    pfVar3 = ptf_jnd_hdrvdp_12bit;
    if (uVar1 == 0xb) {
      pfVar3 = ptf_jnd_hdrvdp_11bit;
    }
    __src = ptf_jnd_hdrvdp_10bit;
    break;
  case PTF_LINEAR:
    fVar5 = this->m_Lmax;
    lVar2 = 0;
    do {
      __dest[lVar2] = ((float)lVar2 / (float)uVar4) * fVar5;
      lVar2 = lVar2 + 1;
    } while (uVar4 + 1 != lVar2);
    return;
  default:
    uVar1 = this->m_bitdepth;
    pfVar3 = ptf_jnd_ferwerda_12bit;
    if (uVar1 == 0xb) {
      pfVar3 = ptf_jnd_ferwerda_11bit;
    }
    __src = ptf_jnd_ferwerda_10bit;
  }
  if (uVar1 != 10) {
    __src = pfVar3;
  }
  memcpy(__dest,__src,uVar4 * 4 + 4);
  return;
}

Assistant:

void LumaQuantizer::setQuantizer(ptf_t ptf, unsigned int bitdepth,
                                 colorSpace_t cs, unsigned int bitdepthC,
                                 float maxLum, float minLum)
{
    if (m_mapping != NULL)
        delete[] m_mapping;
    
    m_bitdepth = bitdepth;
    m_maxVal = (int)pow(2.0f,(float)bitdepth)-1;
    m_colorSpace = cs;
    m_bitdepthColor = bitdepthC;
    m_maxValColor = (int)pow(2.0f,(float)bitdepthC)-1;
    m_Lmax = maxLum;
    m_Lmin = minLum;
    
    m_mapping = new float[m_maxVal+1];
    
    switch (ptf)
    {
    case PTF_PQ:
        setMappingPQ();
        break;
    case PTF_LOG:
        setMappingLog();
        break;
    case PTF_JND_HDRVDP:
        setMappingJNDHDRVDP();
        break;
    case PTF_LINEAR:
        for (size_t i=0; i<=m_maxVal; i++)
	        m_mapping[i] = m_Lmax*((float)i/m_maxVal);
	    break;
    case PTF_PSI:
    default:
        setMappingPsi();
        break;
    }
    
    //for (int i = 0; i<=m_maxVal; i++)
    //    fprintf(stderr, "%0.8f, ", m_mapping[i]);
}